

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int CountTotalScopes(Lexer *lexer)

{
  undefined4 local_18;
  undefined4 local_14;
  Token tok;
  int total;
  Lexer *lexer_local;
  
  local_14 = 1;
  local_18 = GetNextToken(lexer);
  while (local_18 != UNDEFINED) {
    if ((((local_18 == CASE) || (local_18 == SWITCH)) || (local_18 == FOR)) ||
       (((local_18 == IF || (local_18 == WHILE)) || (local_18 == FUNC)))) {
      local_14 = local_14 + 1;
    }
    local_18 = GetNextToken(lexer);
  }
  DestroyLexer(lexer);
  return local_14;
}

Assistant:

int CountTotalScopes(Lexer* lexer){
	int total = 1;
	Token tok = GetNextToken(lexer);
	while (tok != UNDEFINED){
		if (tok == CASE ||
			tok == SWITCH ||
			tok == FOR ||
			tok == IF ||
			tok == WHILE ||
			tok == FUNC) {
			total++;
		}
		tok = GetNextToken(lexer);
	}
	DestroyLexer(lexer);
	return total;
}